

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O0

char * google::protobuf::internal::TcParser::FastGtR2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  TcParseTableBase *pTVar1;
  ParseContext *pPVar2;
  MessageLite *pMVar3;
  uint64_t uVar4;
  EpsCopyInputStream *pEVar5;
  ParseContext *pPVar6;
  byte bVar7;
  bool bVar8;
  unsigned_short uVar9;
  uint16_t uVar10;
  int iVar11;
  uint32_t uVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  FieldAux *pFVar16;
  EpsCopyInputStream *this;
  LogMessage *pLVar17;
  uint *puVar18;
  ulong uVar19;
  TailCallParseFunc UNRECOVERED_JUMPTABLE;
  undefined1 auVar20 [16];
  uint64_t hasbits_local;
  TcParseTableBase *table_local;
  ParseContext *ctx_local;
  char *ptr_local;
  MessageLite *msg_local;
  TcFieldData data_local;
  TcFieldData local_2f8;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_2f0;
  TcParseTableBase ***local_2e8;
  anon_class_24_3_e92acbd4 inner_loop;
  MessageLite *submsg;
  TcParseTableBase *inner_table;
  RepeatedPtrFieldBase *field;
  FieldAux aux;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 aStack_2a8;
  unsigned_short expected_tag;
  uint64_t local_2a0;
  TcParseTableBase *local_298;
  ParseContext *local_290;
  char *local_288;
  MessageLite *local_280;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_278;
  TcFieldData local_270;
  TcFieldData local_268;
  undefined1 local_259;
  uint64_t uStack_258;
  bool always_return;
  TcParseTableBase *local_250;
  ParseContext *local_248;
  char *local_240;
  MessageLite *local_238;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_230;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_228;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_220;
  TcFieldData data_2;
  FastFieldEntry *fast_entry_1;
  size_t idx_1;
  unsigned_short coded_tag_1;
  uint32_t has_bits_offset_1;
  uint32_t has_bits_offset;
  LogMessageFatal local_120 [23];
  Voidify local_109;
  string *local_108;
  string *absl_log_internal_check_op_result_1;
  undefined8 local_f8;
  LogMessageFatal local_f0 [23];
  Voidify local_d9;
  string *local_d8;
  string *absl_log_internal_check_op_result;
  int old_group_depth;
  int old_depth;
  uint32_t local_bc;
  char *local_b8;
  ParseContext *local_b0;
  char *local_a8;
  char *local_a0;
  TcParseTableBase ****local_98;
  TcFieldData local_90;
  EpsCopyInputStream *local_88;
  ParseContext *local_80;
  char *local_78;
  MessageLite *local_70;
  char *local_68;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_60;
  anon_union_8_1_898a9ca8_for_TcFieldData_0 local_58;
  TcFieldData data_1;
  FastFieldEntry *fast_entry;
  size_t idx;
  unsigned_short coded_tag;
  
  local_2a0 = hasbits;
  local_298 = table;
  local_290 = ctx;
  local_288 = ptr;
  local_280 = msg;
  local_278 = data.field_0;
  uVar9 = TcFieldData::coded_tag<unsigned_short>((TcFieldData *)&local_278);
  pMVar3 = local_280;
  pcVar15 = local_288;
  pPVar2 = local_290;
  if (uVar9 != 0) {
    TcFieldData::TcFieldData((TcFieldData *)&stack0xfffffffffffffd58);
    pcVar15 = MiniParse(pMVar3,pcVar15,pPVar2,(TcFieldData)aStack_2a8,local_298,local_2a0);
    return pcVar15;
  }
  aux.map_info.node_size_info._2_2_ = UnalignedLoad<unsigned_short>(local_288);
  pTVar1 = local_298;
  bVar7 = TcFieldData::aux_idx((TcFieldData *)&local_278);
  pFVar16 = TcParseTableBase::field_aux(pTVar1,(uint)bVar7);
  pMVar3 = local_280;
  field = (RepeatedPtrFieldBase *)pFVar16->table;
  uVar10 = TcFieldData::offset((TcFieldData *)&local_278);
  inner_table = (TcParseTableBase *)
                RefAt<google::protobuf::internal::RepeatedPtrFieldBase>(pMVar3,(ulong)uVar10);
  submsg = (MessageLite *)field;
  do {
    local_288 = local_288 + 2;
    inner_loop.inner_table =
         (TcParseTableBase **)
         AddMessage((TcParseTableBase *)submsg,(RepeatedPtrFieldBase *)inner_table);
    pcVar15 = local_288;
    pPVar2 = local_290;
    local_2e8 = &inner_loop.inner_table;
    inner_loop.submsg = (MessageLite **)&local_290;
    inner_loop.ctx = (ParseContext **)&submsg;
    local_bc = FastDecodeTag(aux.map_info.node_size_info._2_2_);
    local_b0 = pPVar2;
    local_b8 = pcVar15;
    _old_group_depth = &local_2e8;
    iVar11 = pPVar2->depth_ + -1;
    pPVar2->depth_ = iVar11;
    if (iVar11 < 0) {
      local_a8 = (char *)0x0;
    }
    else {
      pPVar2->group_depth_ = pPVar2->group_depth_ + 1;
      absl_log_internal_check_op_result._4_4_ = pPVar2->depth_;
      absl_log_internal_check_op_result._0_4_ = pPVar2->group_depth_;
      local_a0 = pcVar15;
      local_70 = (MessageLite *)*local_2e8;
      local_80 = (ParseContext *)*inner_loop.submsg;
      local_78 = pcVar15;
      local_88 = (EpsCopyInputStream *)
                 (((*inner_loop.ctx)->super_EpsCopyInputStream).patch_buffer_ + 0x10);
      local_98 = _old_group_depth;
      while (bVar8 = ParseContext::Done(local_80,&local_78), pMVar3 = local_70, pcVar15 = local_78,
            pPVar6 = local_80, ((bVar8 ^ 0xffU) & 1) != 0) {
        TcFieldData::TcFieldData(&local_90);
        pEVar5 = local_88;
        this = (EpsCopyInputStream *)((long)local_88 + -0x38);
        uVar9 = UnalignedLoad<unsigned_short>(pcVar15);
        if (((long)(int)((uint)uVar9 & (uint)*(byte *)((long)pEVar5 + -0x30)) & 7U) != 0) {
          protobuf_assumption_failed
                    ("(idx & 7) == 0",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                     ,0x44d);
        }
        data_1.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry
                       ((TcParseTableBase *)this,
                        (ulong)(long)(int)((uint)uVar9 & (uint)*(byte *)((long)pEVar5 + -0x30)) >> 3
                       );
        local_58.data =
             (ulong)uVar9 ^
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_1.field_0 + 8))->data;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_1.field_0);
        local_60.data = local_58.data;
        local_78 = (*UNRECOVERED_JUMPTABLE)
                             (pMVar3,pcVar15,pPVar6,(TcFieldData)local_58,(TcParseTableBase *)this,0
                             );
        if ((local_78 == (char *)0x0) ||
           (uVar12 = EpsCopyInputStream::LastTag(&local_80->super_EpsCopyInputStream), uVar12 != 1))
        break;
      }
      if ((*(byte *)((long)local_88 + -0x2f) & 1) == 0) {
        local_68 = local_78;
        local_88 = (EpsCopyInputStream *)((long)local_88 + -0x38);
      }
      else {
        pcVar15 = (char *)((long)local_88 + -0x10);
        local_88 = (EpsCopyInputStream *)((long)local_88 + -0x38);
        local_68 = (char *)(**(code **)pcVar15)(local_70,local_78,local_80);
      }
      local_b8 = local_68;
      if (local_68 != (char *)0x0) {
        iVar11 = absl::lts_20240722::log_internal::GetReferenceableValue
                           (absl_log_internal_check_op_result._4_4_);
        iVar13 = absl::lts_20240722::log_internal::GetReferenceableValue(pPVar2->depth_);
        local_d8 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                             (iVar11,iVar13,"old_depth == depth_");
        if (local_d8 != (string *)0x0) {
          auVar20 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_d8);
          local_f8 = auVar20._8_8_;
          absl_log_internal_check_op_result_1 = auVar20._0_8_;
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_f0,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                     ,0x45b,absl_log_internal_check_op_result_1,local_f8);
          pLVar17 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_f0);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_d9,pLVar17);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_f0);
        }
        iVar11 = absl::lts_20240722::log_internal::GetReferenceableValue
                           ((int)absl_log_internal_check_op_result);
        iVar13 = absl::lts_20240722::log_internal::GetReferenceableValue(pPVar2->group_depth_);
        local_108 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                              (iVar11,iVar13,"old_group_depth == group_depth_");
        if (local_108 != (string *)0x0) {
          auVar20 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_108);
          absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                    (local_120,
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                     ,0x45c,auVar20._0_8_,auVar20._8_8_);
          pLVar17 = absl::lts_20240722::log_internal::LogMessage::InternalStream
                              ((LogMessage *)local_120);
          absl::lts_20240722::log_internal::Voidify::operator&&(&local_109,pLVar17);
          absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_120);
        }
        local_108 = (string *)0x0;
      }
      pPVar2->group_depth_ = pPVar2->group_depth_ + -1;
      pPVar2->depth_ = pPVar2->depth_ + 1;
      bVar8 = EpsCopyInputStream::ConsumeEndGroup(&pPVar2->super_EpsCopyInputStream,local_bc);
      if (((bVar8 ^ 0xffU) & 1) == 0) {
        local_a8 = local_b8;
      }
      else {
        local_a8 = (char *)0x0;
      }
    }
    pMVar3 = local_280;
    pPVar2 = local_290;
    local_288 = local_a8;
    if (local_a8 == (char *)0x0) {
      TcFieldData::TcFieldData((TcFieldData *)&local_2f0);
      pcVar15 = Error(pMVar3,(char *)0x0,pPVar2,(TcFieldData)local_2f0,local_298,local_2a0);
      return pcVar15;
    }
    bVar8 = EpsCopyInputStream::DataAvailable(&local_290->super_EpsCopyInputStream,local_a8);
    pMVar3 = local_280;
    pcVar15 = local_288;
    if (((bVar8 ^ 0xffU) & 1) != 0) {
      TcFieldData::TcFieldData(&local_2f8);
      if (local_298->has_bits_offset != 0) {
        uVar14 = (uint)local_2a0;
        puVar18 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_298->has_bits_offset);
        *puVar18 = uVar14 | *puVar18;
      }
      return pcVar15;
    }
    uVar9 = UnalignedLoad<unsigned_short>(local_288);
    local_238 = local_280;
    local_240 = local_288;
    local_248 = local_290;
    if (uVar9 != aux.map_info.node_size_info._2_2_) {
      TcFieldData::TcFieldData(&data_local);
      local_230 = data_local.field_0;
      local_250 = local_298;
      uStack_258 = local_2a0;
      local_259 = 0;
      bVar8 = EpsCopyInputStream::DataAvailable(&local_248->super_EpsCopyInputStream,local_240);
      pMVar3 = local_238;
      pcVar15 = local_240;
      pPVar2 = local_248;
      if (!bVar8) {
        TcFieldData::TcFieldData(&local_268);
        if (local_250->has_bits_offset != 0) {
          uVar14 = (uint)uStack_258;
          puVar18 = RefAt<unsigned_int>(pMVar3,(ulong)(uint)local_250->has_bits_offset);
          *puVar18 = uVar14 | *puVar18;
        }
        return pcVar15;
      }
      TcFieldData::TcFieldData(&local_270);
      pTVar1 = local_250;
      uVar4 = uStack_258;
      uVar9 = UnalignedLoad<unsigned_short>(pcVar15);
      uVar19 = (ulong)(int)((uint)uVar9 & (uint)pTVar1->fast_idx_mask);
      if ((uVar19 & 7) == 0) {
        data_2.field_0 =
             (anon_union_8_1_898a9ca8_for_TcFieldData_0)
             TcParseTableBase::fast_entry(pTVar1,uVar19 >> 3);
        local_220.data =
             ((anon_union_8_1_898a9ca8_for_TcFieldData_0 *)((long)data_2.field_0 + 8))->data ^
             (ulong)uVar9;
        UNRECOVERED_JUMPTABLE =
             TcParseTableBase::FastFieldEntry::target((FastFieldEntry *)data_2.field_0);
        local_228.data = local_220.data;
        pcVar15 = (*UNRECOVERED_JUMPTABLE)
                            (pMVar3,pcVar15,pPVar2,(TcFieldData)local_220,pTVar1,uVar4);
        return pcVar15;
      }
      protobuf_assumption_failed
                ("(idx & 7) == 0",
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/generated_message_tctable_impl.h"
                 ,0x44d);
    }
  } while( true );
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtR2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return RepeatedParseMessageAuxImpl<uint16_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}